

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pizza_cutter.cpp
# Opt level: O2

bool __thiscall pizza_cutter::is_new_part_valid(pizza_cutter *this,pizza_slice new_part)

{
  long lVar1;
  pointer pvVar2;
  ulong uVar3;
  int col;
  ulong uVar4;
  
  if ((((-1 < (long)new_part._0_8_) && (-1 < new_part.row1)) &&
      (pvVar2 = (this->pizza_).
                super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      (ulong)(new_part._8_8_ >> 0x20) <
      (ulong)((long)*(pointer *)
                     ((long)&(pvVar2->super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>).
                             _M_impl.super__Vector_impl_data + 8) -
              *(long *)&(pvVar2->super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>).
                        _M_impl.super__Vector_impl_data >> 3))) &&
     ((ulong)(long)new_part.row2 <
      (ulong)(((long)(this->pizza_).
                     super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18))) {
    uVar3 = (ulong)(new_part.row1 & 0x7fffffff);
    do {
      if (new_part.row2 < (int)uVar3) {
        return true;
      }
      uVar4 = new_part._0_8_ >> 0x20;
      while ((int)uVar4 <= new_part.col2) {
        lVar1 = uVar4 * 8;
        uVar4 = uVar4 + 1;
        if (*(int *)(*(long *)&pvVar2[uVar3].
                               super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>._M_impl +
                     4 + lVar1) != -1) {
          return false;
        }
      }
      uVar3 = uVar3 + 1;
    } while( true );
  }
  return false;
}

Assistant:

bool pizza_cutter::is_new_part_valid(pizza_slice new_part) const noexcept
{
    if (new_part.col1 < 0 || new_part.col2 >= pizza_[0].size() ||
        new_part.row1 < 0 || new_part.row2 >= pizza_.size()) {
        return false;
    }

    for (int row = new_part.row1; row <= new_part.row2; ++row) {
        for (int col = new_part.col1; col <= new_part.col2; ++col) {
            if (pizza_[row][col].owner != -1)
                return false;
        }
    }

    return true;
}